

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O3

void Rml::PluginRegistry::NotifyShutdown(void)

{
  Plugin *plugin;
  code *pcVar1;
  bool bVar2;
  
  while ((plugin_vectors._8_8_ != 0 ||
         (bVar2 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), bVar2))) {
    if (*(long *)plugin_vectors._8_8_ == *(long *)(plugin_vectors._8_8_ + 8)) {
      ControlledLifetimeResource<Rml::PluginVectors>::Shutdown
                ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
      return;
    }
    plugin = *(Plugin **)(*(long *)(plugin_vectors._8_8_ + 8) + -8);
    UnregisterPlugin(plugin);
    (*plugin->_vptr_Plugin[4])(plugin);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void PluginRegistry::NotifyShutdown()
{
	while (!plugin_vectors->basic.empty())
	{
		Plugin* plugin = plugin_vectors->basic.back();
		PluginRegistry::UnregisterPlugin(plugin);
		plugin->OnShutdown();
	}

	plugin_vectors.Shutdown();
}